

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O0

size_t bitset_extract_setbits_avx512
                 (uint64_t *words,size_t length,uint32_t *vout,size_t outcapacity,uint32_t base)

{
  int iVar1;
  undefined1 (*pauVar2) [64];
  undefined1 (*pauVar3) [64];
  long in_RCX;
  undefined1 (*in_RDX) [64];
  ulong in_RSI;
  long in_RDI;
  uint in_R8D;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  uint32_t val;
  int r;
  uint64_t w;
  __m512i r4;
  __m512i r3;
  __m512i r2;
  __m512i r1;
  __m512i vbase;
  uint8_t advance;
  __m512i vec;
  uint64_t v;
  size_t i;
  __m512i index_table;
  __m512i base_v;
  uint32_t *safeout;
  uint32_t *initout;
  uint32_t *out;
  unsigned_long_long local_1148;
  undefined1 local_1140 [64];
  undefined1 local_1100 [64];
  undefined1 local_10c0 [64];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined1 local_1000 [64];
  undefined1 local_fc0 [64];
  undefined1 local_f80 [64];
  undefined1 local_f40 [64];
  undefined1 local_f00 [64];
  undefined1 local_ec0 [64];
  undefined1 local_e80 [64];
  undefined1 local_e40 [64];
  undefined1 local_e00 [64];
  undefined1 local_dc0 [64];
  undefined1 local_d80 [64];
  undefined1 local_d40 [64];
  undefined1 local_d00 [64];
  undefined1 local_cc0 [64];
  byte local_c41;
  undefined1 local_c40 [64];
  undefined1 local_c00 [64];
  uint64_t local_b90;
  ulong local_b88;
  undefined1 local_b80 [64];
  undefined1 local_b40 [64];
  undefined1 (*local_b00) [64];
  undefined1 (*local_af8) [64];
  undefined1 (*local_af0) [64];
  uint local_ae4;
  ulong local_ad0;
  long local_ac8;
  undefined1 local_ac0 [64];
  uint local_a44;
  undefined1 local_a40 [64];
  uint8_t *local_9c8;
  undefined1 local_9c0 [64];
  undefined1 local_980 [64];
  uint64_t local_908;
  undefined1 local_900 [64];
  undefined1 local_8c0 [64];
  undefined1 local_880 [64];
  undefined1 local_840 [64];
  undefined1 local_800 [64];
  undefined1 local_7c0 [64];
  undefined1 local_780 [64];
  undefined1 local_740 [64];
  undefined1 local_700 [64];
  undefined1 local_6c0 [64];
  undefined1 local_680 [64];
  undefined1 local_640 [64];
  undefined1 local_600 [64];
  undefined1 local_5c0 [64];
  undefined1 local_580 [64];
  undefined1 local_540 [64];
  undefined1 local_500 [64];
  undefined1 local_4c0 [64];
  undefined1 local_480 [64];
  undefined1 local_440 [64];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [64];
  undefined1 local_380 [64];
  undefined1 (*local_308) [64];
  undefined1 local_300 [64];
  undefined1 local_2c0 [64];
  undefined1 (*local_248) [64];
  undefined1 local_240 [64];
  undefined1 local_200 [64];
  undefined1 (*local_188) [64];
  undefined1 local_180 [64];
  undefined1 local_140 [64];
  undefined1 (*local_c8) [64];
  undefined1 local_c0 [64];
  
  local_b00 = (undefined1 (*) [64])(*in_RDX + in_RCX * 4);
  auVar4 = vpbroadcastd_avx512f(ZEXT416(in_R8D));
  local_a40 = vmovdqa64_avx512f(auVar4);
  auVar4 = vmovdqa64_avx512f(local_a40);
  local_b40 = vmovdqa64_avx512f(auVar4);
  local_9c8 = "";
  auVar4 = vmovdqu64_avx512f((undefined1  [64])vbmi2_table);
  local_b80 = vmovdqa64_avx512f(auVar4);
  local_af8 = in_RDX;
  local_af0 = in_RDX;
  local_ae4 = in_R8D;
  local_ad0 = in_RSI;
  local_ac8 = in_RDI;
  for (local_b88 = 0; local_b88 < local_ad0 && local_af0 + 4 < local_b00; local_b88 = local_b88 + 1)
  {
    local_b90 = *(uint64_t *)(local_ac8 + local_b88 * 8);
    auVar4 = vmovdqa64_avx512f(local_b80);
    local_c40 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_c40);
    local_9c0 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_9c0);
    local_980 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_980);
    local_c0 = vmovdqa64_avx512f(ZEXT1664(ZEXT816(0) << 0x40));
    vmovdqa64_avx512f(local_c0);
    auVar4 = vpcompressb_avx512_vbmi2(auVar4,local_b90);
    local_c00 = vmovdqa64_avx512f(auVar4);
    local_908 = local_b90;
    iVar1 = roaring_hamming(local_b90);
    local_c41 = (byte)iVar1;
    auVar4 = vmovdqa64_avx512f(local_b40);
    local_a44 = (int)local_b88 << 6;
    auVar5 = vpbroadcastd_avx512f(ZEXT416(local_a44));
    local_ac0 = vmovdqa64_avx512f(auVar5);
    auVar5 = vmovdqa64_avx512f(local_ac0);
    local_d00 = vmovdqa64_avx512f(auVar4);
    local_d40 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(local_d40);
    local_4c0 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_d00);
    local_500 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_500);
    auVar5 = vmovdqa64_avx512f(local_4c0);
    local_440 = vmovdqa64_avx512f(auVar4);
    local_480 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(local_440);
    auVar5 = vmovdqa64_avx512f(local_480);
    auVar4 = vpaddd_avx512f(auVar4,auVar5);
    local_cc0 = vmovdqa64_avx512f(auVar4);
    local_3d0 = local_c00._0_8_;
    uStack_3c8 = local_c00._8_8_;
    auVar4 = vpmovsxbd_avx512f(local_c00._0_16_);
    local_d80 = vmovdqa64_avx512f(auVar4);
    local_3e0 = local_c00._16_8_;
    uStack_3d8 = local_c00._24_8_;
    auVar4 = vpmovsxbd_avx512f(local_c00._16_16_);
    local_dc0 = vmovdqa64_avx512f(auVar4);
    local_3f0 = local_c00._32_8_;
    uStack_3e8 = local_c00._40_8_;
    auVar4 = vpmovsxbd_avx512f(local_c00._32_16_);
    local_e00 = vmovdqa64_avx512f(auVar4);
    local_400 = local_c00._48_8_;
    uStack_3f8 = local_c00._56_8_;
    auVar4 = vpmovsxbd_avx512f(local_c00._48_16_);
    local_e40 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_d80);
    auVar5 = vmovdqa64_avx512f(local_cc0);
    local_e80 = vmovdqa64_avx512f(auVar4);
    local_ec0 = vmovdqa64_avx512f(auVar5);
    memcpy(local_5c0,local_ec0,0x40);
    memcpy(local_600,local_e80,0x40);
    auVar4 = vmovdqa64_avx512f(local_600);
    auVar5 = vmovdqa64_avx512f(local_5c0);
    local_540 = vmovdqa64_avx512f(auVar4);
    local_580 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(local_540);
    auVar5 = vmovdqa64_avx512f(local_580);
    auVar4 = vpaddd_avx512f(auVar4,auVar5);
    local_d80 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_dc0);
    auVar5 = vmovdqa64_avx512f(local_cc0);
    local_f00 = vmovdqa64_avx512f(auVar4);
    local_f40 = vmovdqa64_avx512f(auVar5);
    memcpy(local_6c0,local_f40,0x40);
    memcpy(local_700,local_f00,0x40);
    auVar4 = vmovdqa64_avx512f(local_700);
    auVar5 = vmovdqa64_avx512f(local_6c0);
    local_640 = vmovdqa64_avx512f(auVar4);
    local_680 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(local_640);
    auVar5 = vmovdqa64_avx512f(local_680);
    auVar4 = vpaddd_avx512f(auVar4,auVar5);
    local_dc0 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_e00);
    auVar5 = vmovdqa64_avx512f(local_cc0);
    local_f80 = vmovdqa64_avx512f(auVar4);
    local_fc0 = vmovdqa64_avx512f(auVar5);
    memcpy(local_7c0,local_fc0,0x40);
    memcpy(local_800,local_f80,0x40);
    auVar4 = vmovdqa64_avx512f(local_800);
    auVar5 = vmovdqa64_avx512f(local_7c0);
    local_740 = vmovdqa64_avx512f(auVar4);
    local_780 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(local_740);
    auVar5 = vmovdqa64_avx512f(local_780);
    auVar4 = vpaddd_avx512f(auVar4,auVar5);
    local_e00 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_e40);
    auVar5 = vmovdqa64_avx512f(local_cc0);
    local_1000 = vmovdqa64_avx512f(auVar4);
    local_1040 = vmovdqa64_avx512f(auVar5);
    memcpy(local_8c0,local_1040,0x40);
    memcpy(local_900,local_1000,0x40);
    pauVar2 = local_af0;
    auVar4 = vmovdqa64_avx512f(local_900);
    auVar5 = vmovdqa64_avx512f(local_8c0);
    local_840 = vmovdqa64_avx512f(auVar4);
    local_880 = vmovdqa64_avx512f(auVar5);
    auVar4 = vmovdqa64_avx512f(local_840);
    auVar5 = vmovdqa64_avx512f(local_880);
    auVar4 = vpaddd_avx512f(auVar4,auVar5);
    local_e40 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_d80);
    local_1080 = vmovdqa64_avx512f(auVar4);
    memcpy(local_180,local_1080,0x40);
    auVar4 = vmovdqa64_avx512f(local_180);
    local_c8 = pauVar2;
    local_140 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_140);
    auVar4 = vmovdqu64_avx512f(auVar4);
    *pauVar2 = auVar4;
    pauVar2 = local_af0 + 1;
    auVar4 = vmovdqa64_avx512f(local_dc0);
    local_10c0 = vmovdqa64_avx512f(auVar4);
    memcpy(local_240,local_10c0,0x40);
    auVar4 = vmovdqa64_avx512f(local_240);
    local_200 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_200);
    auVar4 = vmovdqu64_avx512f(auVar4);
    *pauVar2 = auVar4;
    pauVar3 = local_af0 + 2;
    auVar4 = vmovdqa64_avx512f(local_e00);
    local_1100 = vmovdqa64_avx512f(auVar4);
    local_188 = pauVar2;
    memcpy(local_300,local_1100,0x40);
    auVar4 = vmovdqa64_avx512f(local_300);
    local_2c0 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_2c0);
    auVar4 = vmovdqu64_avx512f(auVar4);
    *pauVar3 = auVar4;
    pauVar2 = local_af0 + 3;
    auVar4 = vmovdqa64_avx512f(local_e40);
    local_1140 = vmovdqa64_avx512f(auVar4);
    local_248 = pauVar3;
    memcpy(local_3c0,local_1140,0x40);
    auVar4 = vmovdqa64_avx512f(local_3c0);
    local_380 = vmovdqa64_avx512f(auVar4);
    auVar4 = vmovdqa64_avx512f(local_380);
    auVar4 = vmovdqu64_avx512f(auVar4);
    *pauVar2 = auVar4;
    local_af0 = (undefined1 (*) [64])(*local_af0 + (long)(int)(uint)local_c41 * 4);
    local_308 = pauVar2;
  }
  local_ae4 = local_ae4 + (int)local_b88 * 0x40;
  for (; local_b88 < local_ad0 && local_af0 < local_b00; local_b88 = local_b88 + 1) {
    for (local_1148 = *(unsigned_long_long *)(local_ac8 + local_b88 * 8);
        local_1148 != 0 && local_af0 < local_b00; local_1148 = local_1148 - 1 & local_1148) {
      iVar1 = roaring_trailing_zeroes(local_1148);
      *(uint *)*local_af0 = iVar1 + local_ae4;
      local_af0 = (undefined1 (*) [64])(*local_af0 + 4);
    }
    local_ae4 = local_ae4 + 0x40;
  }
  return (long)local_af0 - (long)local_af8 >> 2;
}

Assistant:

size_t bitset_extract_setbits_avx512(const uint64_t *words, size_t length,
                                     uint32_t *vout, size_t outcapacity,
                                     uint32_t base) {
    uint32_t *out = (uint32_t *)vout;
    uint32_t *initout = out;
    uint32_t *safeout = out + outcapacity;
    __m512i base_v = _mm512_set1_epi32(base);
    __m512i index_table = _mm512_loadu_si512(vbmi2_table);
    size_t i = 0;

    for (; (i < length) && ((out + 64) < safeout); i += 1) {
        uint64_t v = words[i];
        __m512i vec = _mm512_maskz_compress_epi8(v, index_table);

        uint8_t advance = (uint8_t)roaring_hamming(v);

        __m512i vbase =
            _mm512_add_epi32(base_v, _mm512_set1_epi32((int)(i * 64)));
        __m512i r1 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 0));
        __m512i r2 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 1));
        __m512i r3 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 2));
        __m512i r4 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 3));

        r1 = _mm512_add_epi32(r1, vbase);
        r2 = _mm512_add_epi32(r2, vbase);
        r3 = _mm512_add_epi32(r3, vbase);
        r4 = _mm512_add_epi32(r4, vbase);
        _mm512_storeu_si512((__m512i *)out, r1);
        _mm512_storeu_si512((__m512i *)(out + 16), r2);
        _mm512_storeu_si512((__m512i *)(out + 32), r3);
        _mm512_storeu_si512((__m512i *)(out + 48), r4);

        out += advance;
    }

    base += i * 64;

    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            out++;
            w &= (w - 1);
        }
        base += 64;
    }

    return out - initout;
}